

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReichMooreScatteringRadiusUncertainties.test.cpp
# Opt level: O3

void verifyChunk(ReichMooreScatteringRadiusUncertainties *chunk)

{
  long lVar1;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef macroName_03;
  StringRef macroName_04;
  StringRef macroName_05;
  StringRef macroName_06;
  StringRef macroName_07;
  StringRef macroName_08;
  StringRef macroName_09;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef capturedExpression_03;
  StringRef capturedExpression_04;
  StringRef capturedExpression_05;
  StringRef capturedExpression_06;
  StringRef capturedExpression_07;
  StringRef capturedExpression_08;
  StringRef capturedExpression_09;
  AssertionHandler catchAssertionHandler;
  double local_d8;
  AssertionHandler local_d0;
  undefined1 local_88 [8];
  undefined8 local_80;
  char *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70 [2];
  ITransientExpression local_50;
  double *local_40;
  WithinRelMatcher *local_38;
  
  local_88 = (undefined1  [8])0x18d464;
  local_80 = (pointer)0x53;
  macroName.m_size = 10;
  macroName.m_start = "CHECK_THAT";
  capturedExpression.m_size = 0x1c;
  capturedExpression.m_start = "1., WithinRel( chunk.DAP() )";
  Catch::AssertionHandler::AssertionHandler
            (&local_d0,macroName,(SourceLineInfo *)local_88,capturedExpression,ContinueOnFailure);
  local_d8 = 1.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_88,
             *(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_88,&local_d8);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c7360;
  local_40 = &local_d8;
  local_38 = (WithinRelMatcher *)local_88;
  Catch::AssertionHandler::handleExpr(&local_d0,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_88);
  Catch::AssertionHandler::complete(&local_d0);
  if (local_d0.m_completed == false) {
    (*(local_d0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_88 = (undefined1  [8])0x18d464;
  local_80 = (pointer)0x54;
  macroName_00.m_size = 10;
  macroName_00.m_start = "CHECK_THAT";
  capturedExpression_00.m_size = 0x2b;
  capturedExpression_00.m_start = "1., WithinRel( chunk.defaultUncertainty() )";
  Catch::AssertionHandler::AssertionHandler
            (&local_d0,macroName_00,(SourceLineInfo *)local_88,capturedExpression_00,
             ContinueOnFailure);
  local_d8 = 1.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_88,
             *(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_88,&local_d8);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c7360;
  local_40 = &local_d8;
  local_38 = (WithinRelMatcher *)local_88;
  Catch::AssertionHandler::handleExpr(&local_d0,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_88);
  Catch::AssertionHandler::complete(&local_d0);
  if (local_d0.m_completed == false) {
    (*(local_d0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_88 = (undefined1  [8])0x18d464;
  local_80 = (pointer)0x56;
  macroName_01.m_size = 5;
  macroName_01.m_start = "CHECK";
  capturedExpression_01.m_size = 0x18;
  capturedExpression_01.m_start = "3 == chunk.DAPL().size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_d0,macroName_01,(SourceLineInfo *)local_88,capturedExpression_01,
             ContinueOnFailure);
  lVar1 = (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish +
          (-8 - (long)(chunk->super_ListRecord).data.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
  local_70[0]._8_8_ = lVar1 >> 3;
  local_80._1_1_ = lVar1 == 0x18;
  local_80._0_1_ = true;
  local_88 = (undefined1  [8])&PTR_streamReconstructedExpression_001c73a0;
  local_80._4_4_ = 3;
  local_78 = "==";
  local_70[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_d0,(ITransientExpression *)local_88);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_88);
  Catch::AssertionHandler::complete(&local_d0);
  if (local_d0.m_completed == false) {
    (*(local_d0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_88 = (undefined1  [8])0x18d464;
  local_80 = (pointer)0x57;
  macroName_02.m_size = 5;
  macroName_02.m_start = "CHECK";
  capturedExpression_02.m_size = 0x21;
  capturedExpression_02.m_start = "3 == chunk.uncertainties().size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_d0,macroName_02,(SourceLineInfo *)local_88,capturedExpression_02,
             ContinueOnFailure);
  lVar1 = (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish +
          (-8 - (long)(chunk->super_ListRecord).data.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
  local_70[0]._8_8_ = lVar1 >> 3;
  local_80._1_1_ = lVar1 == 0x18;
  local_80._0_1_ = true;
  local_88 = (undefined1  [8])&PTR_streamReconstructedExpression_001c73a0;
  local_80._4_4_ = 3;
  local_78 = "==";
  local_70[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_d0,(ITransientExpression *)local_88);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_88);
  Catch::AssertionHandler::complete(&local_d0);
  if (local_d0.m_completed == false) {
    (*(local_d0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_88 = (undefined1  [8])0x18d464;
  local_80 = (pointer)0x59;
  macroName_03.m_size = 10;
  macroName_03.m_start = "CHECK_THAT";
  capturedExpression_03.m_size = 0x20;
  capturedExpression_03.m_start = "2., WithinRel( chunk.DAPL()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_d0,macroName_03,(SourceLineInfo *)local_88,capturedExpression_03,
             ContinueOnFailure);
  local_d8 = 2.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_88,
             (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[1]);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_88,&local_d8);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c7360;
  local_40 = &local_d8;
  local_38 = (WithinRelMatcher *)local_88;
  Catch::AssertionHandler::handleExpr(&local_d0,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_88);
  Catch::AssertionHandler::complete(&local_d0);
  if (local_d0.m_completed == false) {
    (*(local_d0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_88 = (undefined1  [8])0x18d464;
  local_80 = (pointer)0x5a;
  macroName_04.m_size = 10;
  macroName_04.m_start = "CHECK_THAT";
  capturedExpression_04.m_size = 0x20;
  capturedExpression_04.m_start = "3., WithinRel( chunk.DAPL()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_d0,macroName_04,(SourceLineInfo *)local_88,capturedExpression_04,
             ContinueOnFailure);
  local_d8 = 3.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_88,
             (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[2]);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_88,&local_d8);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c7360;
  local_40 = &local_d8;
  local_38 = (WithinRelMatcher *)local_88;
  Catch::AssertionHandler::handleExpr(&local_d0,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_88);
  Catch::AssertionHandler::complete(&local_d0);
  if (local_d0.m_completed == false) {
    (*(local_d0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_88 = (undefined1  [8])0x18d464;
  local_80 = (pointer)0x5b;
  macroName_05.m_size = 10;
  macroName_05.m_start = "CHECK_THAT";
  capturedExpression_05.m_size = 0x20;
  capturedExpression_05.m_start = "4., WithinRel( chunk.DAPL()[2] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_d0,macroName_05,(SourceLineInfo *)local_88,capturedExpression_05,
             ContinueOnFailure);
  local_d8 = 4.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_88,
             (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[3]);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_88,&local_d8);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c7360;
  local_40 = &local_d8;
  local_38 = (WithinRelMatcher *)local_88;
  Catch::AssertionHandler::handleExpr(&local_d0,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_88);
  Catch::AssertionHandler::complete(&local_d0);
  if (local_d0.m_completed == false) {
    (*(local_d0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_88 = (undefined1  [8])0x18d464;
  local_80 = (pointer)0x5c;
  macroName_06.m_size = 10;
  macroName_06.m_start = "CHECK_THAT";
  capturedExpression_06.m_size = 0x29;
  capturedExpression_06.m_start = "2., WithinRel( chunk.uncertainties()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_d0,macroName_06,(SourceLineInfo *)local_88,capturedExpression_06,
             ContinueOnFailure);
  local_d8 = 2.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_88,
             (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[1]);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_88,&local_d8);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c7360;
  local_40 = &local_d8;
  local_38 = (WithinRelMatcher *)local_88;
  Catch::AssertionHandler::handleExpr(&local_d0,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_88);
  Catch::AssertionHandler::complete(&local_d0);
  if (local_d0.m_completed == false) {
    (*(local_d0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_88 = (undefined1  [8])0x18d464;
  local_80 = (pointer)0x5d;
  macroName_07.m_size = 10;
  macroName_07.m_start = "CHECK_THAT";
  capturedExpression_07.m_size = 0x29;
  capturedExpression_07.m_start = "3., WithinRel( chunk.uncertainties()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_d0,macroName_07,(SourceLineInfo *)local_88,capturedExpression_07,
             ContinueOnFailure);
  local_d8 = 3.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_88,
             (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[2]);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_88,&local_d8);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c7360;
  local_40 = &local_d8;
  local_38 = (WithinRelMatcher *)local_88;
  Catch::AssertionHandler::handleExpr(&local_d0,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_88);
  Catch::AssertionHandler::complete(&local_d0);
  if (local_d0.m_completed == false) {
    (*(local_d0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_88 = (undefined1  [8])0x18d464;
  local_80 = (pointer)0x5e;
  macroName_08.m_size = 10;
  macroName_08.m_start = "CHECK_THAT";
  capturedExpression_08.m_size = 0x29;
  capturedExpression_08.m_start = "4., WithinRel( chunk.uncertainties()[2] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_d0,macroName_08,(SourceLineInfo *)local_88,capturedExpression_08,
             ContinueOnFailure);
  local_d8 = 4.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_88,
             (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[3]);
  local_50.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_88,&local_d8);
  local_50.m_isBinaryExpression = true;
  local_50._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001c7360;
  local_40 = &local_d8;
  local_38 = (WithinRelMatcher *)local_88;
  Catch::AssertionHandler::handleExpr(&local_d0,&local_50);
  Catch::ITransientExpression::~ITransientExpression(&local_50);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_88);
  Catch::AssertionHandler::complete(&local_d0);
  if (local_d0.m_completed == false) {
    (*(local_d0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_88 = (undefined1  [8])0x18d464;
  local_80 = (pointer)0x60;
  macroName_09.m_size = 5;
  macroName_09.m_start = "CHECK";
  capturedExpression_09.m_size = 0xf;
  capturedExpression_09.m_start = "2 == chunk.NC()";
  Catch::AssertionHandler::AssertionHandler
            (&local_d0,macroName_09,(SourceLineInfo *)local_88,capturedExpression_09,
             ContinueOnFailure);
  local_70[0]._8_8_ =
       (((long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start >> 3) + 5) / 6 + 1;
  local_80._1_1_ = local_70[0]._8_8_ == 2;
  local_80._0_1_ = true;
  local_88 = (undefined1  [8])&PTR_streamReconstructedExpression_001c73e0;
  local_80._4_4_ = 2;
  local_78 = "==";
  local_70[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_d0,(ITransientExpression *)local_88);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_88);
  Catch::AssertionHandler::complete(&local_d0);
  if (local_d0.m_completed == false) {
    (*(local_d0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  return;
}

Assistant:

void verifyChunk( const ReichMooreScatteringRadiusUncertainties& chunk ) {

  CHECK_THAT( 1., WithinRel( chunk.DAP() ) );
  CHECK_THAT( 1., WithinRel( chunk.defaultUncertainty() ) );

  CHECK( 3 == chunk.DAPL().size() );
  CHECK( 3 == chunk.uncertainties().size() );

  CHECK_THAT( 2., WithinRel( chunk.DAPL()[0] ) );
  CHECK_THAT( 3., WithinRel( chunk.DAPL()[1] ) );
  CHECK_THAT( 4., WithinRel( chunk.DAPL()[2] ) );
  CHECK_THAT( 2., WithinRel( chunk.uncertainties()[0] ) );
  CHECK_THAT( 3., WithinRel( chunk.uncertainties()[1] ) );
  CHECK_THAT( 4., WithinRel( chunk.uncertainties()[2] ) );

  CHECK( 2 == chunk.NC() );
}